

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Gia_Man_t * Acb_CreateMiter(Gia_Man_t *pF,Gia_Man_t *pG)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pGVar5;
  bool bVar6;
  int local_38;
  int iXor;
  int iMiter;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pOne;
  Gia_Man_t *pNew;
  Gia_Man_t *pG_local;
  Gia_Man_t *pF_local;
  
  local_38 = 0;
  Gia_ManFillValue(pF);
  Gia_ManFillValue(pG);
  iVar1 = Gia_ManObjNum(pF);
  iVar2 = Gia_ManObjNum(pF);
  p = Gia_ManStart(iVar1 + iVar2 + 1000);
  Gia_ManHashAlloc(p);
  pGVar4 = Gia_ManConst0(pF);
  pGVar4->Value = 0;
  pGVar4 = Gia_ManConst0(pG);
  pGVar4->Value = 0;
  iXor = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pF->vCis);
    bVar6 = false;
    if (iXor < iVar1) {
      _iMiter = Gia_ManCi(pF,iXor);
      bVar6 = _iMiter != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    uVar3 = Gia_ManAppendCi(p);
    _iMiter->Value = uVar3;
    iXor = iXor + 1;
  }
  iXor = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pG->vCis);
    bVar6 = false;
    if (iXor < iVar1) {
      _iMiter = Gia_ManCi(pG,iXor);
      bVar6 = _iMiter != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    pGVar4 = Gia_ManCi(pF,iXor);
    _iMiter->Value = pGVar4->Value;
    iXor = iXor + 1;
  }
  iXor = 0;
  while( true ) {
    bVar6 = false;
    if (iXor < pF->nObjs) {
      _iMiter = Gia_ManObj(pF,iXor);
      bVar6 = _iMiter != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjIsAnd(_iMiter);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(_iMiter);
      iVar2 = Gia_ObjFanin1Copy(_iMiter);
      uVar3 = Gia_ManHashAnd(p,iVar1,iVar2);
      _iMiter->Value = uVar3;
    }
    iXor = iXor + 1;
  }
  iXor = 0;
  while( true ) {
    bVar6 = false;
    if (iXor < pG->nObjs) {
      _iMiter = Gia_ManObj(pG,iXor);
      bVar6 = _iMiter != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjIsAnd(_iMiter);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(_iMiter);
      iVar2 = Gia_ObjFanin1Copy(_iMiter);
      uVar3 = Gia_ManHashAnd(p,iVar1,iVar2);
      _iMiter->Value = uVar3;
    }
    iXor = iXor + 1;
  }
  iXor = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pG->vCos);
    bVar6 = false;
    if (iXor < iVar1) {
      _iMiter = Gia_ManCo(pG,iXor);
      bVar6 = _iMiter != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjFanin0Copy(_iMiter);
    pGVar4 = Gia_ManCo(pF,iXor);
    iVar2 = Gia_ObjFanin0Copy(pGVar4);
    iVar1 = Gia_ManHashXor(p,iVar1,iVar2);
    local_38 = Gia_ManHashOr(p,local_38,iVar1);
    iXor = iXor + 1;
  }
  Gia_ManAppendCo(p,local_38);
  iXor = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pF->vCos);
    bVar6 = false;
    if (iXor < iVar1) {
      _iMiter = Gia_ManCo(pF,iXor);
      bVar6 = _iMiter != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ManCoNum(pG);
    if (iVar1 <= iXor) {
      iVar1 = Gia_ObjFanin0Copy(_iMiter);
      Gia_ManAppendCo(p,iVar1);
    }
    iXor = iXor + 1;
  }
  Gia_ManHashStop(p);
  pGVar5 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar5;
}

Assistant:

Gia_Man_t * Acb_CreateMiter( Gia_Man_t * pF, Gia_Man_t * pG )
{
    Gia_Man_t * pNew, * pOne;
    Gia_Obj_t * pObj;
    int i, iMiter = 0, iXor;
    Gia_ManFillValue( pF );
    Gia_ManFillValue( pG );
    pNew = Gia_ManStart( Gia_ManObjNum(pF) + Gia_ManObjNum(pF) + 1000 );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(pF)->Value = 0;
    Gia_ManConst0(pG)->Value = 0;
    Gia_ManForEachCi( pF, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachCi( pG, pObj, i )
        pObj->Value = Gia_ManCi(pF, i)->Value;
    Gia_ManForEachAnd( pF, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachAnd( pG, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pG, pObj, i )
    {
        iXor = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin0Copy(Gia_ManCo(pF, i)) );
        iMiter = Gia_ManHashOr( pNew, iMiter, iXor );
    }
    Gia_ManAppendCo( pNew, iMiter );
    Gia_ManForEachCo( pF, pObj, i )
        if ( i >= Gia_ManCoNum(pG) )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}